

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filereader.cpp
# Opt level: O2

void __thiscall
indigox::utils::FileReader::GetAllItems
          (FileReader *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *out_items)

{
  istream *piVar1;
  char *pcVar2;
  ostream *poVar3;
  String line;
  String next_item;
  ifstream infile;
  byte abStack_398 [488];
  istringstream itemiser;
  
  next_item._M_dataplus._M_p = (pointer)&next_item.field_2;
  next_item._M_string_length = 0;
  next_item.field_2._M_local_buf[0] = '\0';
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&infile);
  std::ifstream::open((string *)&infile,(_Ios_Openmode)this);
  if ((abStack_398[*(long *)(_infile + -0x18)] & 5) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Unable to open file: ");
    poVar3 = std::operator<<(poVar3,(string *)this);
    std::endl<char,std::char_traits<char>>(poVar3);
    exit(1);
  }
  do {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&infile,(string *)&line);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) {
      std::ifstream::close();
      std::ifstream::~ifstream(&infile);
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::string::~string((string *)&next_item);
      return;
    }
    std::__cxx11::istringstream::istringstream((istringstream *)&itemiser,(string *)&line,_S_in);
    while( true ) {
      piVar1 = std::operator>>((istream *)&itemiser,(string *)&next_item);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      pcVar2 = (char *)std::__cxx11::string::at((ulong)&next_item);
      if (*pcVar2 == '#') break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(out_items,&next_item);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&itemiser);
  } while( true );
}

Assistant:

void FileReader::GetAllItems(std::vector<String> &out_items)
    {
      String next_item, line;
      std::ifstream infile;
      infile.open(path_);
      
      /// @todo Throw an exception when can't open file.
      if (!infile) {
        std::cerr << "Unable to open file: " << path_ << std::endl;
        std::exit(1);
      }
      
      while (std::getline(infile, line)) {
        std::istringstream itemiser(line);
        while (itemiser >> next_item) {
          if (next_item.at(0) == '#') break;
          out_items.push_back(next_item);
        }
      }
      
      infile.close();
    }